

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

type cm::operator==(StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *l,basic_string_view<char,_std::char_traits<char>_> *r)

{
  bool bVar1;
  string_view __y;
  string local_48;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  basic_string_view<char,_std::char_traits<char>_> *r_local;
  StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *l_local;
  
  local_18 = r;
  r_local = &l->l;
  StringOpPlus::operator_cast_to_string(&local_48,(StringOpPlus *)l);
  local_28 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  __y = AsStringView<std::basic_string_view<char,_std::char_traits<char>_>_>::view(local_18);
  bVar1 = std::operator==(local_28,__y);
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

typename std::enable_if<AsStringView<R>::value, bool>::type operator==(
  StringOpPlus<LL, LR> const& l, R&& r)
{
  return std::string(l) == AsStringView<R>::view(std::forward<R>(r));
}